

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# castchannel.h
# Opt level: O2

size_t __thiscall CastMessage::size_content(CastMessage *this)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  
  sVar1 = ec::msg_protoc3::size_var<unsigned_int,void>
                    ((msg_protoc3 *)this,1,this->_protocol_version,true);
  sVar2 = ec::msg_protoc3::size_str((msg_protoc3 *)this,2,(this->_source_id)._M_dataplus._M_p);
  sVar3 = ec::msg_protoc3::size_str((msg_protoc3 *)this,3,(this->_destination_id)._M_dataplus._M_p);
  sVar4 = ec::msg_protoc3::size_str((msg_protoc3 *)this,4,(this->_namespace)._M_dataplus._M_p);
  sVar5 = ec::msg_protoc3::size_var<unsigned_int,void>
                    ((msg_protoc3 *)this,5,this->_payload_type,true);
  sVar6 = ec::msg_protoc3::size_str((msg_protoc3 *)this,6,(this->_payload_utf8)._M_dataplus._M_p);
  sVar7 = ec::msg_protoc3::size_cls
                    ((msg_protoc3 *)this,7,(this->_payload_binary)._M_dataplus._M_p,
                     (this->_payload_binary)._M_string_length);
  return sVar7 + sVar6 + sVar5 + sVar4 + sVar3 + sVar2 + sVar1;
}

Assistant:

size_t size_content() override {
        return
            size_var(id_protocol_version, _protocol_version, true) +
            size_str(id_source_id, _source_id.c_str()) +
            size_str(id_destination_id, _destination_id.c_str()) +
            size_str(id_namespace, _namespace.c_str()) +
            size_var(id_payload_type, _payload_type, true) +
            size_str(id_payload_utf8, _payload_utf8.c_str()) +
            size_cls(id_payload_binary, _payload_binary.data(), _payload_binary.size());
    }